

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDirectDemo_ls.c
# Opt level: O0

sunrealtype MaxError(N_Vector y,sunrealtype t)

{
  long lVar1;
  undefined8 in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  sunrealtype jfact_inv;
  sunrealtype ifact_inv;
  sunrealtype maxError;
  sunrealtype yt;
  sunrealtype ex;
  sunrealtype er;
  sunrealtype *ydata;
  sunindextype k;
  sunindextype j;
  sunindextype i;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_8;
  
  local_48 = 0.0;
  local_58 = 0.0;
  local_68 = 1.0;
  if ((in_XMM0_Qa != 0.0) || (NAN(in_XMM0_Qa))) {
    lVar1 = N_VGetArrayPointer(in_RDI);
    if (in_XMM0_Qa <= 30.0) {
      local_48 = exp(in_XMM0_Qa * -2.0);
    }
    for (local_28 = 0; local_28 < 5; local_28 = local_28 + 1) {
      local_60 = 1.0;
      for (local_20 = 0; local_20 < 5; local_20 = local_20 + 1) {
        dVar2 = pow(in_XMM0_Qa,(double)(local_20 + local_28));
        dVar2 = ABS(*(double *)(lVar1 + (local_20 + local_28 * 5) * 8) -
                    dVar2 * local_48 * local_60 * local_68);
        if (local_58 < dVar2) {
          local_58 = dVar2;
        }
        local_60 = local_60 / (double)(local_20 + 1);
      }
      local_68 = local_68 / (double)(local_28 + 1);
    }
    local_8 = local_58;
  }
  else {
    local_8 = 0.0;
  }
  return local_8;
}

Assistant:

static sunrealtype MaxError(N_Vector y, sunrealtype t)
{
  sunindextype i, j, k;
  sunrealtype *ydata, er, ex = ZERO, yt, maxError = ZERO, ifact_inv,
                          jfact_inv = ONE;

  if (t == ZERO) { return (ZERO); }

  ydata = N_VGetArrayPointer(y);
  if (t <= THIRTY) { ex = exp(-TWO * t); }

  for (j = 0; j < P2_MESHY; j++)
  {
    ifact_inv = ONE;
    for (i = 0; i < P2_MESHX; i++)
    {
      k  = i + j * P2_MESHX;
      yt = pow(t, i + j) * ex * ifact_inv * jfact_inv;
      er = fabs(ydata[k] - yt);
      if (er > maxError) { maxError = er; }
      ifact_inv /= (i + 1);
    }
    jfact_inv /= (j + 1);
  }
  return (maxError);
}